

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O0

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest16::verifySubroutineUniformValuesForShaderStage
          (FunctionalTest16 *this,_shader_stage *shader_stage,
          _subroutine_uniform_value_verification *verification)

{
  deUint32 err;
  RenderContext *pRVar1;
  GLuint extraout_var;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  GLenum shader_stage_glenum;
  GLenum shader_stage_glenum_00;
  GLenum shader_stage_glenum_01;
  string local_528;
  MessageBuilder local_508;
  string local_388;
  MessageBuilder local_368;
  string local_1e8;
  MessageBuilder local_1b8;
  GLuint local_38;
  GLuint local_34;
  GLuint result_values [4];
  Functions *gl;
  _subroutine_uniform_value_verification *verification_local;
  _shader_stage *shader_stage_local;
  FunctionalTest16 *this_local;
  
  pRVar1 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  result_values[2] = (*pRVar1->_vptr_RenderContext[3])();
  result_values[3] = extraout_var;
  memset(&local_38,0,0x10);
  (**(code **)(result_values._8_8_ + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine1_uniform_location,&local_38);
  (**(code **)(result_values._8_8_ + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine2_uniform_location,&local_34);
  (**(code **)(result_values._8_8_ + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine3_uniform_location,result_values);
  (**(code **)(result_values._8_8_ + 0xb50))
            (shader_stage->gl_stage,shader_stage->subroutine4_uniform_location,result_values + 1);
  err = (**(code **)(result_values._8_8_ + 0x800))();
  glu::checkError(err,"glGetUniformSubroutineuiv() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x226d);
  if (*verification == SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES) {
    if ((((local_38 != shader_stage->subroutine1_uniform_location) &&
         (local_38 != shader_stage->subroutine2_uniform_location)) ||
        (((local_34 != shader_stage->subroutine1_uniform_location &&
          (local_34 != shader_stage->subroutine2_uniform_location)) ||
         ((result_values[0] != shader_stage->subroutine3_uniform_location &&
          (result_values[0] != shader_stage->subroutine4_uniform_location)))))) ||
       ((result_values[1] != shader_stage->subroutine3_uniform_location &&
        (result_values[1] != shader_stage->subroutine4_uniform_location)))) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_1b8,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_1b8,
                          (char (*) [74])
                          "SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES validation failed. Shader stage:["
                         );
      Utils::getShaderStageStringFromGLEnum_abi_cxx11_
                (&local_1e8,(Utils *)(ulong)shader_stage->gl_stage,shader_stage_glenum);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1e8);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [19])"], expected data:[");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->subroutine1_uniform_location);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])" OR ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->subroutine2_uniform_location);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [7])" x 2, ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->subroutine3_uniform_location);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [5])" OR ");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->subroutine4_uniform_location);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])" x 2], found data:[");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_38);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_34);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,result_values);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,result_values + 1);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2aea36f);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_1e8);
      tcu::MessageBuilder::~MessageBuilder(&local_1b8);
      this->m_has_test_passed = false;
    }
  }
  else if (*verification == SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES) {
    if (((local_38 != shader_stage->default_subroutine1_value) ||
        (local_34 != shader_stage->default_subroutine2_value)) ||
       ((result_values[0] != shader_stage->default_subroutine3_value ||
        (result_values[1] != shader_stage->default_subroutine4_value)))) {
      pTVar2 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_368,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar3 = tcu::MessageBuilder::operator<<
                         (&local_368,
                          (char (*) [76])
                          "SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES validation failed. Shader stage:["
                         );
      Utils::getShaderStageStringFromGLEnum_abi_cxx11_
                (&local_388,(Utils *)(ulong)shader_stage->gl_stage,shader_stage_glenum_00);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_388);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [19])"], expected data:[");
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->default_subroutine1_value);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->default_subroutine2_value);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->default_subroutine3_value);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->default_subroutine4_value);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])0x2a11747);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_38);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_34);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,result_values);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,result_values + 1);
      pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2aea36f);
      tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_388);
      tcu::MessageBuilder::~MessageBuilder(&local_368);
      this->m_has_test_passed = false;
    }
  }
  else if ((((local_38 == shader_stage->default_subroutine1_value) ||
            (local_34 == shader_stage->default_subroutine2_value)) ||
           (result_values[0] == shader_stage->default_subroutine3_value)) ||
          (result_values[1] == shader_stage->default_subroutine4_value)) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_508,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_508,
                        (char (*) [79])
                        "SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES validation failed. Shader stage:["
                       );
    Utils::getShaderStageStringFromGLEnum_abi_cxx11_
              (&local_528,(Utils *)(ulong)shader_stage->gl_stage,shader_stage_glenum_01);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_528);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [20])"], expected data:![");
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->default_subroutine1_value);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->default_subroutine2_value);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->default_subroutine3_value);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&shader_stage->default_subroutine4_value);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])0x2a11747);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_38);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_34);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,result_values);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2a3caab);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,result_values + 1);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2aea36f);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_528);
    tcu::MessageBuilder::~MessageBuilder(&local_508);
    this->m_has_test_passed = false;
  }
  return;
}

Assistant:

void FunctionalTest16::verifySubroutineUniformValuesForShaderStage(
	const _shader_stage& shader_stage, const _subroutine_uniform_value_verification& verification)
{
	const glw::Functions& gl			   = m_context.getRenderContext().getFunctions();
	glw::GLuint			  result_values[4] = { 0 };

	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine1_uniform_location, result_values + 0);
	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine2_uniform_location, result_values + 1);
	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine3_uniform_location, result_values + 2);
	gl.getUniformSubroutineuiv(shader_stage.gl_stage, shader_stage.subroutine4_uniform_location, result_values + 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformSubroutineuiv() call(s) failed.");

	if (verification == SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES)
	{
		if (!((result_values[0] == (GLuint)shader_stage.subroutine1_uniform_location ||
			   result_values[0] == (GLuint)shader_stage.subroutine2_uniform_location) &&
			  (result_values[1] == (GLuint)shader_stage.subroutine1_uniform_location ||
			   result_values[1] == (GLuint)shader_stage.subroutine2_uniform_location) &&
			  (result_values[2] == (GLuint)shader_stage.subroutine3_uniform_location ||
			   result_values[2] == (GLuint)shader_stage.subroutine4_uniform_location) &&
			  (result_values[3] == (GLuint)shader_stage.subroutine3_uniform_location ||
			   result_values[3] == (GLuint)shader_stage.subroutine4_uniform_location)))
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "SUBROUTINE_UNIFORMS_SET_TO_VALID_VALUES validation failed. "
														   "Shader stage:["
							   << Utils::getShaderStageStringFromGLEnum(shader_stage.gl_stage) << "], "
																								  "expected data:["
							   << shader_stage.subroutine1_uniform_location << " OR "
							   << shader_stage.subroutine2_uniform_location << " x 2, "
							   << shader_stage.subroutine3_uniform_location << " OR "
							   << shader_stage.subroutine4_uniform_location << " x 2], "
																			   "found data:["
							   << result_values[0] << ", " << result_values[1] << ", " << result_values[2] << ", "
							   << result_values[3] << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	}
	else if (verification == SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES)
	{
		if (result_values[0] != shader_stage.default_subroutine1_value ||
			result_values[1] != shader_stage.default_subroutine2_value ||
			result_values[2] != shader_stage.default_subroutine3_value ||
			result_values[3] != shader_stage.default_subroutine4_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "SUBROUTINE_UNIFORMS_SET_TO_DEFAULT_VALUES validation failed. "
								  "Shader stage:["
							   << Utils::getShaderStageStringFromGLEnum(shader_stage.gl_stage) << "], "
																								  "expected data:["
							   << shader_stage.default_subroutine1_value << ", "
							   << shader_stage.default_subroutine2_value << ", "
							   << shader_stage.default_subroutine3_value << ", "
							   << shader_stage.default_subroutine4_value << "], "
																			"found data:["
							   << result_values[0] << ", " << result_values[1] << ", " << result_values[2] << ", "
							   << result_values[3] << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	}
	else
	{
		DE_ASSERT(verification == SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES);

		if (result_values[0] == shader_stage.default_subroutine1_value ||
			result_values[1] == shader_stage.default_subroutine2_value ||
			result_values[2] == shader_stage.default_subroutine3_value ||
			result_values[3] == shader_stage.default_subroutine4_value)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "SUBROUTINE_UNIFORMS_SET_TO_NONDEFAULT_VALUES validation failed. "
								  "Shader stage:["
							   << Utils::getShaderStageStringFromGLEnum(shader_stage.gl_stage) << "], "
																								  "expected data:!["
							   << shader_stage.default_subroutine1_value << ", "
							   << shader_stage.default_subroutine2_value << ", "
							   << shader_stage.default_subroutine3_value << ", "
							   << shader_stage.default_subroutine4_value << "], "
																			"found data:["
							   << result_values[0] << ", " << result_values[1] << ", " << result_values[2] << ", "
							   << result_values[3] << "]." << tcu::TestLog::EndMessage;

			m_has_test_passed = false;
		}
	}
}